

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paseto-v2-local-encrypt.c
# Opt level: O0

int main(void)

{
  ulong uVar1;
  char *pcVar2;
  void *__ptr;
  size_t sVar3;
  char *encrypted;
  size_t message_len;
  uint8_t *message;
  uint8_t key [32];
  
  uVar1 = paseto_init();
  if ((uVar1 & 1) == 0) {
    fprintf(_stderr,"Failed to initialize libpaseto\n");
    exit(-1);
  }
  pcVar2 = getenv("PASETO_V2_LOCAL_SECRET");
  uVar1 = paseto_v2_local_load_key_base64(&message,pcVar2);
  if ((uVar1 & 1) == 0) {
    perror("Failed to load key");
    exit(-1);
  }
  __ptr = malloc(0x10000);
  if (__ptr == (void *)0x0) {
    perror("Failed to allocate input buffer");
    exit(-1);
  }
  sVar3 = fread(__ptr,1,0xffff,_stdin);
  pcVar2 = (char *)paseto_v2_local_encrypt(__ptr,sVar3,&message,0);
  free(__ptr);
  if (pcVar2 == (char *)0x0) {
    perror("paseto_v2_local_encrypt failed");
    exit(-1);
  }
  puts(pcVar2);
  paseto_free(pcVar2);
  return 0;
}

Assistant:

int main() {
    if (!paseto_init()) {
        fprintf(stderr, "Failed to initialize libpaseto\n");
        exit(-1);
    }

    uint8_t key[paseto_v2_LOCAL_KEYBYTES];
	if (!paseto_v2_local_load_key_base64(key,
				getenv("PASETO_V2_LOCAL_SECRET"))) {
        perror("Failed to load key");
        exit(-1);
    }
    uint8_t *message = malloc(BUF_SIZE);
    if (!message) {
        perror("Failed to allocate input buffer");
        exit(-1);
    }
    size_t message_len = fread(message, 1, BUF_SIZE - 1, stdin);
    char *encrypted = paseto_v2_local_encrypt(
            message, message_len, key, NULL, 0);
	free(message);
    if (!encrypted) {
        perror("paseto_v2_local_encrypt failed");
        exit(-1);
    }
	puts(encrypted);
    paseto_free(encrypted);
}